

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O2

void cfd::TransactionContextUtil::AddScriptHashSign<cfd::TransactionContext>
               (TransactionContext *transaction,OutPoint *outpoint,
               vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *signatures,
               Script *redeem_script,AddressType address_type,bool is_multisig_script)

{
  pointer pSVar1;
  bool bVar2;
  pointer pSVar3;
  pointer pSVar4;
  OutPoint *outpoint_00;
  bool bVar5;
  SignDataType SVar6;
  CfdException *pCVar7;
  SignParameter *signature;
  pointer pSVar8;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  AddressType address_type_local;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> scriptsig;
  undefined1 local_e8 [120];
  OutPoint *local_70;
  Script locking_script;
  
  address_type_local = address_type;
  bVar5 = core::Script::IsEmpty(redeem_script);
  if (bVar5) {
    local_e8._0_8_ = "cfd_transaction_internal.cpp";
    local_e8._8_4_ = 0xa7;
    local_e8._16_8_ = (long)"CfdAddScriptHashSign" + 3;
    core::logger::warn<>((CfdSourceLocation *)local_e8,"Failed to AddScriptHashSign. Empty script.")
    ;
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)local_e8,"Empty script.",(allocator *)&locking_script);
    core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_e8);
    __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_70 = outpoint;
  bVar5 = core::OutPoint::IsValid(outpoint);
  if (bVar5) {
    pSVar8 = (signatures->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (signatures->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      if (pSVar8 == pSVar1) {
        core::Script::Script(&locking_script);
        sign_params.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        sign_params.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        sign_params.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (address_type == kP2shAddress) {
          bVar5 = true;
          if (is_multisig_script) {
            SignParameter::SignParameter
                      ((SignParameter *)local_e8,(ScriptOperator *)core::ScriptOperator::OP_0);
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
            emplace_back<cfd::SignParameter>(&sign_params,(SignParameter *)local_e8);
            SignParameter::~SignParameter((SignParameter *)local_e8);
          }
          bVar2 = false;
        }
        else {
          if (address_type == kP2wshAddress) {
            bVar5 = false;
          }
          else {
            if (address_type != kP2shP2wshAddress) {
              local_e8._0_8_ = "cfd_transaction_internal.cpp";
              local_e8._8_4_ = 0xcf;
              local_e8._16_8_ = (long)"CfdAddScriptHashSign" + 3;
              core::logger::warn<cfd::core::AddressType&>
                        ((CfdSourceLocation *)local_e8,
                         "Failed to AddScriptHashSign. Invalid address_type: {}",&address_type_local
                        );
              pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
              std::__cxx11::string::string
                        ((string *)local_e8,
                         "Invalid address_type. address_type must be \"p2wsh\" or \"p2sh-p2wsh\" or \"p2sh\"."
                         ,(allocator *)&scriptsig);
              core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_e8);
              __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
            }
            core::ScriptUtil::CreateP2wshLockingScript((Script *)local_e8,redeem_script);
            core::Script::operator=(&locking_script,(Script *)local_e8);
            core::Script::~Script((Script *)local_e8);
            bVar5 = true;
          }
          bVar2 = true;
          if (is_multisig_script) {
            core::ByteData::ByteData((ByteData *)&scriptsig);
            SignParameter::SignParameter((SignParameter *)local_e8,(ByteData *)&scriptsig);
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
            emplace_back<cfd::SignParameter>(&sign_params,(SignParameter *)local_e8);
            SignParameter::~SignParameter((SignParameter *)local_e8);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptsig);
          }
        }
        pSVar1 = (signatures->
                 super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pSVar8 = (signatures->
                      super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pSVar4 = sign_params.
                     super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
            pSVar3 = sign_params.
                     super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
                     _M_impl.super__Vector_impl_data._M_start, pSVar8 != pSVar1; pSVar8 = pSVar8 + 1
            ) {
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                    (&sign_params,pSVar8);
        }
        SignParameter::SignParameter((SignParameter *)local_e8,redeem_script);
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
        emplace_back<cfd::SignParameter>(&sign_params,(SignParameter *)local_e8);
        SignParameter::~SignParameter((SignParameter *)local_e8);
        outpoint_00 = local_70;
        if (bVar2) {
          AddSign<cfd::TransactionContext>(transaction,local_70,&sign_params,true,pSVar3 != pSVar4);
        }
        if (bVar5) {
          bVar5 = core::Script::IsEmpty(&locking_script);
          if (bVar5) {
            AddSign<cfd::TransactionContext>
                      (transaction,outpoint_00,&sign_params,false,pSVar3 != pSVar4);
          }
          else {
            scriptsig.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            scriptsig.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            scriptsig.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            SignParameter::SignParameter((SignParameter *)local_e8,&locking_script);
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
            emplace_back<cfd::SignParameter>(&scriptsig,(SignParameter *)local_e8);
            SignParameter::~SignParameter((SignParameter *)local_e8);
            AddSign<cfd::TransactionContext>(transaction,outpoint_00,&scriptsig,false,true);
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
                      (&scriptsig);
          }
        }
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&sign_params);
        core::Script::~Script(&locking_script);
        return;
      }
      SVar6 = SignParameter::GetDataType(pSVar8);
      if (SVar6 != kSign) {
        SVar6 = SignParameter::GetDataType(pSVar8);
        if (SVar6 != kBinary) {
          local_e8._0_8_ = "cfd_transaction_internal.cpp";
          local_e8._8_4_ = 0xb3;
          local_e8._16_8_ = (long)"CfdAddScriptHashSign" + 3;
          locking_script._vptr_Script._0_4_ = SignParameter::GetDataType(pSVar8);
          core::logger::warn<cfd::SignDataType>
                    ((CfdSourceLocation *)local_e8,
                     "Failed to AddScriptHashSign. Invalid signature type: {}",
                     (SignDataType *)&locking_script);
          pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)local_e8,
                     "Invalid signature type. signature type must be \"kSign\" or \"kBinary\".",
                     (allocator *)&locking_script);
          core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_e8);
          __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
      }
      pSVar8 = pSVar8 + 1;
    } while( true );
  }
  local_e8._0_8_ = "cfd_transaction_internal.cpp";
  local_e8._8_4_ = 0xab;
  local_e8._16_8_ = (long)"CfdAddScriptHashSign" + 3;
  core::logger::warn<>
            ((CfdSourceLocation *)local_e8,"Failed to AddScriptHashSign. Invalid outpoint.");
  pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)local_e8,"Invalid outpoint.",(allocator *)&locking_script);
  core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_e8);
  __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionContextUtil::AddScriptHashSign(
    Tx* transaction, const OutPoint& outpoint,
    const std::vector<SignParameter>& signatures, const Script& redeem_script,
    AddressType address_type, bool is_multisig_script) {
  if (redeem_script.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "Failed to AddScriptHashSign. Empty script.");
    throw CfdException(CfdError::kCfdIllegalArgumentError, "Empty script.");
  }
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddScriptHashSign. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }
  for (const auto& signature : signatures) {
    if ((signature.GetDataType() != SignDataType::kSign) &&
        (signature.GetDataType() != SignDataType::kBinary)) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to AddScriptHashSign. Invalid signature type: {}",
          signature.GetDataType());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid signature type. signature type must be \"kSign\" "
          "or \"kBinary\".");  // NOLINT
    }
  }

  bool has_witness = false;
  bool has_scriptsig = false;
  Script locking_script;
  std::vector<SignParameter> sign_params;
  switch (address_type) {
    case AddressType::kP2wshAddress:
      has_witness = true;
      break;
    case AddressType::kP2shP2wshAddress:
      has_witness = true;
      has_scriptsig = true;
      locking_script = ScriptUtil::CreateP2wshLockingScript(redeem_script);
      break;
    case AddressType::kP2shAddress:
      has_scriptsig = true;
      break;
    default:
      warn(
          CFD_LOG_SOURCE,
          "Failed to AddScriptHashSign. Invalid address_type: {}",
          address_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid address_type. address_type must be \"p2wsh\" "
          "or \"p2sh-p2wsh\" or \"p2sh\".");  // NOLINT
  }
  if (is_multisig_script) {
    if (has_witness) {
      sign_params.push_back(SignParameter(ByteData()));
    } else {
      sign_params.push_back(SignParameter(ScriptOperator::OP_0));
    }
  }
  for (const auto& signature : signatures) {
    sign_params.push_back(signature);
  }
  bool clear_stack = (sign_params.empty()) ? false : true;
  sign_params.push_back(SignParameter(redeem_script));

  if (has_witness) {
    AddSign(transaction, outpoint, sign_params, true, clear_stack);
  }
  if (has_scriptsig) {
    if (!locking_script.IsEmpty()) {  // p2sh-p2wpkh
      std::vector<SignParameter> scriptsig;
      scriptsig.push_back(SignParameter(locking_script));
      AddSign(transaction, outpoint, scriptsig, false, true);
    } else {
      AddSign(transaction, outpoint, sign_params, false, clear_stack);
    }
  }
}